

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O2

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::dump
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"     name = ");
  poVar1 = std::operator<<(poVar1,(this->super_sc_signal_channel).super_sc_prim_channel.
                                  super_sc_object.m_name._M_dataplus._M_p);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"    value = ");
  sc_dt::sc_logic::print(&this->m_cur_val,poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"new value = ");
  sc_dt::sc_logic::print(&this->m_new_val,poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
sc_signal_t<T,POL>::dump( ::std::ostream& os ) const
{
    os << "     name = " << name() << ::std::endl;
    os << "    value = " << m_cur_val << ::std::endl;
    os << "new value = " << m_new_val << ::std::endl;
}